

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_perform(connectdata *conn,_Bool *connected,_Bool *dophase_done)

{
  Curl_easy *pCVar1;
  undefined4 *puVar2;
  bool bVar3;
  int iVar4;
  _Bool selected;
  imap_conn *imapc;
  IMAP *imap;
  Curl_easy *data;
  CURLcode result;
  _Bool *dophase_done_local;
  _Bool *connected_local;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  puVar2 = (undefined4 *)(pCVar1->req).protop;
  bVar3 = false;
  if ((*(ulong *)&(conn->data->set).field_0x888 >> 0x1c & 1) != 0) {
    *puVar2 = 1;
  }
  *dophase_done = false;
  if ((((*(long *)(puVar2 + 2) != 0) && ((conn->proto).imapc.mailbox != (char *)0x0)) &&
      (iVar4 = Curl_strcasecompare(*(char **)(puVar2 + 2),(conn->proto).imapc.mailbox), iVar4 != 0))
     && (((*(long *)(puVar2 + 4) == 0 || ((conn->proto).imapc.mailbox_uidvalidity == (char *)0x0))
         || (iVar4 = Curl_strcasecompare(*(char **)(puVar2 + 4),
                                         (conn->proto).imapc.mailbox_uidvalidity), iVar4 != 0)))) {
    bVar3 = true;
  }
  if (((*(ulong *)&(conn->data->set).field_0x888 >> 0x1d & 1) == 0) &&
     ((pCVar1->set).mimepost.kind == MIMEKIND_NONE)) {
    if ((*(long *)(puVar2 + 0x10) == 0) || ((!bVar3 && (*(long *)(puVar2 + 2) != 0)))) {
      if ((*(long *)(puVar2 + 0x10) == 0) &&
         ((bVar3 && ((*(long *)(puVar2 + 6) != 0 || (*(long *)(puVar2 + 8) != 0)))))) {
        data._4_4_ = imap_perform_fetch(conn);
      }
      else if ((*(long *)(puVar2 + 0x10) == 0) && ((bVar3 && (*(long *)(puVar2 + 0xe) != 0)))) {
        data._4_4_ = imap_perform_search(conn);
      }
      else if (((*(long *)(puVar2 + 2) == 0) || (bVar3)) ||
              ((((*(long *)(puVar2 + 0x10) == 0 && (*(long *)(puVar2 + 6) == 0)) &&
                (*(long *)(puVar2 + 8) == 0)) && (*(long *)(puVar2 + 0xe) == 0)))) {
        data._4_4_ = imap_perform_list(conn);
      }
      else {
        data._4_4_ = imap_perform_select(conn);
      }
    }
    else {
      data._4_4_ = imap_perform_list(conn);
    }
  }
  else {
    data._4_4_ = imap_perform_append(conn);
  }
  if (data._4_4_ == CURLE_OK) {
    conn_local._4_4_ = imap_multi_statemach(conn,dophase_done);
    *connected = (_Bool)((conn->bits).tcpconnect[0] & 1);
  }
  else {
    conn_local._4_4_ = data._4_4_;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_perform(struct connectdata *conn, bool *connected,
                             bool *dophase_done)
{
  /* This is IMAP and no proxy */
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct IMAP *imap = data->req.protop;
  struct imap_conn *imapc = &conn->proto.imapc;
  bool selected = FALSE;

  DEBUGF(infof(conn->data, "DO phase starts\n"));

  if(conn->data->set.opt_no_body) {
    /* Requested no body means no transfer */
    imap->transfer = FTPTRANSFER_INFO;
  }

  *dophase_done = FALSE; /* not done yet */

  /* Determine if the requested mailbox (with the same UIDVALIDITY if set)
     has already been selected on this connection */
  if(imap->mailbox && imapc->mailbox &&
     strcasecompare(imap->mailbox, imapc->mailbox) &&
     (!imap->uidvalidity || !imapc->mailbox_uidvalidity ||
      strcasecompare(imap->uidvalidity, imapc->mailbox_uidvalidity)))
    selected = TRUE;

  /* Start the first command in the DO phase */
  if(conn->data->set.upload || data->set.mimepost.kind != MIMEKIND_NONE)
    /* APPEND can be executed directly */
    result = imap_perform_append(conn);
  else if(imap->custom && (selected || !imap->mailbox))
    /* Custom command using the same mailbox or no mailbox */
    result = imap_perform_list(conn);
  else if(!imap->custom && selected && (imap->uid || imap->mindex))
    /* FETCH from the same mailbox */
    result = imap_perform_fetch(conn);
  else if(!imap->custom && selected && imap->query)
    /* SEARCH the current mailbox */
    result = imap_perform_search(conn);
  else if(imap->mailbox && !selected &&
         (imap->custom || imap->uid || imap->mindex || imap->query))
    /* SELECT the mailbox */
    result = imap_perform_select(conn);
  else
    /* LIST */
    result = imap_perform_list(conn);

  if(result)
    return result;

  /* Run the state-machine */
  result = imap_multi_statemach(conn, dophase_done);

  *connected = conn->bits.tcpconnect[FIRSTSOCKET];

  if(*dophase_done)
    DEBUGF(infof(conn->data, "DO phase is complete\n"));

  return result;
}